

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iopause.c
# Opt level: O3

void iopause(iopause_fd *x,uint len,taia *deadline,taia *stamp)

{
  ushort uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  int iVar13;
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar37;
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  fd_set wfds;
  fd_set rfds;
  timeval tv;
  taia t;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  timeval local_58;
  taia local_48;
  long lVar16;
  
  uVar5 = (ulong)len;
  iVar7 = taia_less(deadline,stamp);
  iVar10 = 0;
  if (iVar7 == 0) {
    local_48.atto = stamp->atto;
    local_48.sec.x = (stamp->sec).x;
    local_48.nano = stamp->nano;
    taia_sub(&local_48,deadline,&local_48);
    dVar11 = taia_approx(&local_48);
    dVar17 = 1000.0;
    if (dVar11 <= 1000.0) {
      dVar17 = dVar11;
    }
    iVar10 = (int)(dVar17 * 1000.0 + 20.0);
  }
  auVar6 = _DAT_001097a0;
  if (len == 0) {
    local_d8 = ZEXT816(0);
    local_c8 = ZEXT816(0);
    local_b8 = ZEXT816(0);
    local_a8 = ZEXT816(0);
    local_98 = ZEXT816(0);
    local_88 = ZEXT816(0);
    local_78 = ZEXT816(0);
    local_68 = ZEXT816(0);
    local_158 = ZEXT816(0);
    local_148 = ZEXT816(0);
    local_138 = ZEXT816(0);
    local_128 = ZEXT816(0);
    local_118 = ZEXT816(0);
    local_108 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    local_e8 = ZEXT816(0);
  }
  else {
    lVar16 = uVar5 - 1;
    auVar12._8_4_ = (int)lVar16;
    auVar12._0_8_ = lVar16;
    auVar12._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_001097a0;
    auVar15 = _DAT_00109760;
    auVar18 = _DAT_00109770;
    auVar19 = _DAT_00109780;
    auVar20 = _DAT_00109790;
    do {
      auVar21 = auVar20 ^ auVar6;
      iVar7 = auVar12._0_4_;
      iVar34 = -(uint)(iVar7 < auVar21._0_4_);
      iVar13 = auVar12._4_4_;
      auVar22._4_4_ = -(uint)(iVar13 < auVar21._4_4_);
      iVar38 = auVar12._8_4_;
      iVar37 = -(uint)(iVar38 < auVar21._8_4_);
      iVar14 = auVar12._12_4_;
      auVar22._12_4_ = -(uint)(iVar14 < auVar21._12_4_);
      auVar31._4_4_ = iVar34;
      auVar31._0_4_ = iVar34;
      auVar31._8_4_ = iVar37;
      auVar31._12_4_ = iVar37;
      auVar39 = pshuflw(in_XMM11,auVar31,0xe8);
      auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar13);
      auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar14);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar41 = pshuflw(in_XMM12,auVar24,0xe8);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar40 = pshuflw(auVar39,auVar22,0xe8);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar40 | auVar41 & auVar39) ^ auVar21;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x->revents + uVar8) = 0;
      }
      auVar22 = auVar24 & auVar31 | auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)&x[1].revents + uVar8) = 0;
      }
      auVar21 = auVar19 ^ auVar6;
      iVar34 = -(uint)(iVar7 < auVar21._0_4_);
      auVar35._4_4_ = -(uint)(iVar13 < auVar21._4_4_);
      iVar37 = -(uint)(iVar38 < auVar21._8_4_);
      auVar35._12_4_ = -(uint)(iVar14 < auVar21._12_4_);
      auVar23._4_4_ = iVar34;
      auVar23._0_4_ = iVar34;
      auVar23._8_4_ = iVar37;
      auVar23._12_4_ = iVar37;
      auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar13);
      auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar14);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar35._0_4_ = auVar35._4_4_;
      auVar35._8_4_ = auVar35._12_4_;
      auVar21 = auVar30 & auVar23 | auVar35;
      auVar21 = packssdw(auVar21,auVar21);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[2].revents + uVar8) = 0;
      }
      auVar24 = pshufhw(auVar23,auVar23,0x84);
      auVar31 = pshufhw(auVar30,auVar30,0x84);
      auVar22 = pshufhw(auVar24,auVar35,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
      auVar24 = packssdw(auVar25,auVar25);
      if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[3].revents + uVar8) = 0;
      }
      auVar24 = auVar18 ^ auVar6;
      iVar34 = -(uint)(iVar7 < auVar24._0_4_);
      auVar27._4_4_ = -(uint)(iVar13 < auVar24._4_4_);
      iVar37 = -(uint)(iVar38 < auVar24._8_4_);
      auVar27._12_4_ = -(uint)(iVar14 < auVar24._12_4_);
      auVar32._4_4_ = iVar34;
      auVar32._0_4_ = iVar34;
      auVar32._8_4_ = iVar37;
      auVar32._12_4_ = iVar37;
      auVar21 = pshuflw(auVar21,auVar32,0xe8);
      auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar13);
      auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar14);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      in_XMM12 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
      in_XMM12 = in_XMM12 & auVar21;
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar21 = pshuflw(auVar21,auVar27,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar21 | in_XMM12) ^ auVar39;
      auVar21 = packssdw(auVar39,auVar39);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[4].revents + uVar8) = 0;
      }
      auVar27 = auVar26 & auVar32 | auVar27;
      auVar21 = packssdw(auVar27,auVar27);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[5].revents + uVar8) = 0;
      }
      auVar21 = auVar15 ^ auVar6;
      iVar7 = -(uint)(iVar7 < auVar21._0_4_);
      auVar36._4_4_ = -(uint)(iVar13 < auVar21._4_4_);
      iVar38 = -(uint)(iVar38 < auVar21._8_4_);
      auVar36._12_4_ = -(uint)(iVar14 < auVar21._12_4_);
      auVar28._4_4_ = iVar7;
      auVar28._0_4_ = iVar7;
      auVar28._8_4_ = iVar38;
      auVar28._12_4_ = iVar38;
      auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar13);
      auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar14);
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar21 = auVar33 & auVar28 | auVar36;
      auVar21 = packssdw(auVar21,auVar21);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[6].revents + uVar8) = 0;
      }
      auVar21 = pshufhw(auVar28,auVar28,0x84);
      auVar22 = pshufhw(auVar33,auVar33,0x84);
      auVar24 = pshufhw(auVar21,auVar36,0x84);
      auVar29._8_4_ = 0xffffffff;
      auVar29._0_8_ = 0xffffffffffffffff;
      auVar29._12_4_ = 0xffffffff;
      auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
      auVar21 = packssdw(auVar29,auVar29);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&x[7].revents + uVar8) = 0;
      }
      lVar16 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar16 + 8;
      lVar16 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar16 + 8;
      lVar16 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar16 + 8;
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar16 + 8;
      uVar8 = uVar8 + 0x40;
    } while ((uVar5 * 8 + 0x38 & 0xffffffffffffffc0) != uVar8);
    local_d8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    local_118 = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    if (len != 0) {
      iVar7 = 1;
      uVar8 = 0;
      do {
        uVar2 = x[uVar8].fd;
        if (uVar2 < 0x400) {
          iVar13 = uVar2 + 1;
          if ((int)uVar2 < iVar7) {
            iVar13 = iVar7;
          }
          uVar1 = x[uVar8].events;
          if ((uVar1 & 1) != 0) {
            *(ulong *)(local_d8 + (ulong)(uVar2 >> 6) * 8) =
                 *(ulong *)(local_d8 + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
          }
          iVar7 = iVar13;
          if ((uVar1 & 4) != 0) {
            *(ulong *)(local_158 + (ulong)(uVar2 >> 6) * 8) =
                 *(ulong *)(local_158 + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
      goto LAB_001073dd;
    }
  }
  iVar7 = 1;
LAB_001073dd:
  local_58.tv_sec = (__time_t)(iVar10 / 1000);
  local_58.tv_usec = (__suseconds_t)((iVar10 % 1000) * 1000);
  iVar7 = select(iVar7,(fd_set *)local_d8,(fd_set *)local_158,(fd_set *)0x0,&local_58);
  if (len != 0 && 0 < iVar7) {
    uVar8 = 0;
    do {
      uVar2 = x[uVar8].fd;
      uVar9 = (ulong)uVar2;
      if (uVar9 < 0x400) {
        if (((x[uVar8].events & 1U) != 0) &&
           ((*(ulong *)(local_d8 + (ulong)(uVar2 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar8].revents = (byte)x[uVar8].revents | 1;
        }
        if (((x[uVar8].events & 4U) != 0) &&
           ((*(ulong *)(local_158 + (ulong)(uVar2 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar8].revents = (byte)x[uVar8].revents | 4;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void iopause(iopause_fd *x,unsigned int len,struct taia *deadline,struct taia *stamp)
{
  struct taia t;
  int millisecs;
  double d;
  int i;

  if (taia_less(deadline,stamp))
    millisecs = 0;
  else {
    t = *stamp;
    taia_sub(&t,deadline,&t);
    d = taia_approx(&t);
    if (d > 1000.0) d = 1000.0;
    millisecs = d * 1000.0 + 20.0;
  }

  for (i = 0;i < len;++i)
    x[i].revents = 0;

#ifdef IOPAUSE_POLL

  poll(x,len,millisecs);
  /* XXX: some kernels apparently need x[0] even if len is 0 */
  /* XXX: how to handle EAGAIN? are kernels really this dumb? */
  /* XXX: how to handle EINVAL? when exactly can this happen? */

#else
{

  struct timeval tv;
  fd_set rfds;
  fd_set wfds;
  int nfds;
  int fd;

  FD_ZERO(&rfds);
  FD_ZERO(&wfds);

  nfds = 1;
  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (fd >= nfds) nfds = fd + 1;
    if (x[i].events & IOPAUSE_READ) FD_SET(fd,&rfds);
    if (x[i].events & IOPAUSE_WRITE) FD_SET(fd,&wfds);
  }

  tv.tv_sec = millisecs / 1000;
  tv.tv_usec = 1000 * (millisecs % 1000);

  if (select(nfds,&rfds,&wfds,(fd_set *) 0,&tv) <= 0)
    return;
    /* XXX: for EBADF, could seek out and destroy the bad descriptor */

  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (x[i].events & IOPAUSE_READ)
      if (FD_ISSET(fd,&rfds)) x[i].revents |= IOPAUSE_READ;
    if (x[i].events & IOPAUSE_WRITE)
      if (FD_ISSET(fd,&wfds)) x[i].revents |= IOPAUSE_WRITE;
  }

}
#endif

}